

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

void __thiscall CEPlanet::Update_SOFA(CEPlanet *this,double new_jd)

{
  ostream *poVar1;
  long in_RDI;
  double in_XMM0_Qa;
  int j;
  int i;
  double pvh [2] [3];
  int err;
  double pvhe [2] [3];
  double pvb [2] [3];
  double mjd;
  double tdb2;
  double tdb1;
  CEBody *in_stack_fffffffffffffe58;
  double *in_stack_fffffffffffffe60;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe70;
  string *psVar2;
  allocator_type *in_stack_fffffffffffffe88;
  allocator_type *__a;
  double *in_stack_fffffffffffffe90;
  double *__last;
  double *in_stack_fffffffffffffe98;
  double *__first;
  vector<double,_std::allocator<double>_> *this_00;
  string local_140 [39];
  double local_119 [9];
  int local_d0;
  int local_cc;
  double local_c8 [7];
  int local_8c;
  double local_88 [6];
  double local_58 [3];
  vector<double,_std::allocator<double>_> local_40;
  double local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = 0;
  local_20 = 0;
  local_28 = CEDate::GetMJD2JDFactor();
  local_28 = in_XMM0_Qa - local_28;
  CEDate::UTC2TDB(in_stack_fffffffffffffe60,(double *)in_stack_fffffffffffffe58,(double *)0x160074);
  local_8c = iauEpv00(local_18,local_20,local_88,local_58);
  if ((*(double *)(in_RDI + 0x78) != 3.5) || (NAN(*(double *)(in_RDI + 0x78)))) {
    local_8c = iauPlan94(local_18,local_20,(int)*(double *)(in_RDI + 0x78),local_c8);
    for (local_cc = 0; local_cc < 2; local_cc = local_cc + 1) {
      for (local_d0 = 0; local_d0 < 3; local_d0 = local_d0 + 1) {
        local_58[(long)local_cc * 3 + (long)local_d0] =
             local_c8[(long)local_cc * 3 + (long)local_d0] +
             (local_58[(long)local_cc * 3 + (long)local_d0] -
             local_88[(long)local_cc * 3 + (long)local_d0]);
      }
    }
  }
  if (local_8c == 0) {
    this_00 = &local_40;
    std::allocator<double>::allocator((allocator<double> *)0x160216);
    std::vector<double,std::allocator<double>>::vector<double*,void>
              (this_00,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88
              );
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe70);
    std::allocator<double>::~allocator((allocator<double> *)0x16026c);
    __a = (allocator_type *)&local_40;
    __last = &local_28;
    __first = local_119;
    std::allocator<double>::allocator((allocator<double> *)0x160298);
    std::vector<double,std::allocator<double>>::vector<double*,void>(this_00,__first,__last,__a);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe70);
    std::allocator<double>::~allocator((allocator<double> *)0x1602e9);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"[ERROR] failed to compute planet positions for "
                            );
    psVar2 = local_140;
    CEBody::Name_abi_cxx11_(in_stack_fffffffffffffe58);
    poVar1 = std::operator<<(poVar1,psVar2);
    poVar1 = std::operator<<(poVar1,". ErrCode=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8c);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_140);
  }
  return;
}

Assistant:

void CEPlanet::Update_SOFA(double new_jd) const
{
    // Compute the TDB based on supplied jd
    double tdb1(0.0);
    double tdb2(0.0);
    double mjd = new_jd - CEDate::GetMJD2JDFactor();
    CEDate::UTC2TDB(mjd, &tdb1, &tdb2);

    // Compute the Earth relative corrections
    double pvb[2][3];
    double pvhe[2][3];
    int err = iauEpv00(tdb1, tdb2, pvhe, pvb);

    // If this isn't the earth, compute the planet's heliocentric position
    if (sofa_planet_id_ != 3.5) {
        double pvh[2][3];
        err = iauPlan94(tdb1, tdb2, sofa_planet_id_, pvh) ;

        // Compute the corrected factors for heliocentric -> barycentric as
        //      bary_planet = helio_planet + (bary_earth - helio_earth)
        for (int i=0; i<2; i++) {
            for (int j=0; j<3; j++) {
                pvb[i][j] = pvh[i][j] + (pvb[i][j] - pvhe[i][j]);
            }
        }
    }
    
    // If the returned error code is zero, compute the values
    if (err == 0) {
        // position
        pos_icrs_ = std::vector<double>(pvb[0], pvb[0]+3);
    
        // velocity
        vel_icrs_ = std::vector<double>(pvb[1], pvb[1]+3);
    } else {
        std::cerr << "[ERROR] failed to compute planet positions for " << Name() << ". ErrCode=" << err << "\n" ;
    }
}